

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chapter1.cpp
# Opt level: O0

void __thiscall UIContext::Detail::~Detail(Detail *this)

{
  long in_RDI;
  GLFWwindow *unaff_retaddr;
  
  ImGui_ImplOpenGL3_Shutdown();
  ImGui_ImplGlfw_Shutdown();
  ImGui::DestroyContext((ImGuiContext *)0x11908a);
  glfwDestroyWindow(unaff_retaddr);
  glfwTerminate();
  std::function<void_(ApplicationContextBase_&)>::~function
            ((function<void_(ApplicationContextBase_&)> *)0x1190b0);
  std::__cxx11::string::~string((string *)(in_RDI + 0x10));
  return;
}

Assistant:

~Detail()
    {
        // Cleanup
        ImGui_ImplOpenGL3_Shutdown();
        ImGui_ImplGlfw_Shutdown();
        ImGui::DestroyContext();

        glfwDestroyWindow(_window);
        glfwTerminate();
    }